

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::forward
          (DeconvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar8;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  _func_int *p_Var11;
  int *piVar12;
  void *pvVar13;
  Layer *pLVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined4 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  Mat *pMVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  _func_int *p_Var39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  float *pfVar44;
  int _h;
  int iVar45;
  int iVar46;
  size_t sVar47;
  int iVar48;
  undefined1 (*pauVar49) [16];
  undefined1 (*pauVar50) [32];
  int iVar51;
  ulong uVar52;
  uint uVar53;
  int _w;
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar70;
  float fVar71;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar84 [28];
  float fVar72;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar73 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar118 [16];
  float fVar116;
  float fVar117;
  float fVar133;
  float fVar135;
  float fVar137;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar136;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar132;
  float fVar134;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 in_ZMM7 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar146;
  undefined1 auVar145 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [32];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_2e0;
  long local_2d0;
  int local_2c8;
  int local_2b8;
  uint local_2a8;
  Mat local_288;
  undefined8 local_238;
  Mat *local_220;
  ulong local_218;
  void *local_210;
  void *local_208;
  _func_int **local_200;
  undefined1 local_1f8 [40];
  undefined1 auStack_1d0 [16];
  ulong uStack_1c0;
  size_t local_1b8;
  undefined1 local_1a8 [40];
  undefined1 local_180 [16];
  int local_170;
  size_t local_168;
  ulong local_158;
  Mat *local_150;
  int local_148;
  int iStack_144;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Allocator *local_118;
  int local_110;
  Allocator *local_108;
  undefined1 local_100 [16];
  int local_f0;
  ulong local_e8;
  void *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ulong local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined1 local_b0 [16];
  int local_a0;
  ulong local_98;
  undefined1 local_88 [16];
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  undefined1 auVar101 [32];
  undefined1 auVar104 [32];
  undefined1 auVar131 [32];
  undefined1 auVar152 [64];
  
  uVar43 = bottom_blob->elemsize;
  iVar48 = bottom_blob->elempack;
  uVar52 = (ulong)iVar48;
  p_Var39 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  uVar31 = 1;
  if (opt->use_packing_layout == true) {
    uVar31 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var39) & 7) != 0) {
      uVar31 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var39) & 3) == 0) * 3 + 1;
    }
  }
  uVar3 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  auVar118._4_4_ = uVar8;
  auVar118._0_4_ = uVar3;
  uVar4 = *(ulong *)(&this->field_0xd4 + (long)p_Var39);
  uVar5 = *(ulong *)(&this->field_0xe4 + (long)p_Var39);
  uVar6 = *(ulong *)(&this->field_0xdc + (long)p_Var39);
  uVar7 = *(ulong *)(&this->field_0xfc + (long)p_Var39);
  uVar32 = bottom_blob->c;
  uVar41 = (ulong)uVar32;
  local_288.cstep = 0;
  auVar91 = (undefined1  [16])0x0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  p_Var11 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  p_Var39 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx + (long)p_Var11);
  lVar42 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var11) < 1) && (*(int *)(p_Var39 + 0xf0) < 1)) &&
       (*(int *)(p_Var39 + 0xf4) < 1)) && (*(int *)(p_Var39 + 0xf8) < 1)) &&
     ((*(int *)(p_Var39 + 0x104) < 1 || (*(int *)(p_Var39 + 0x108) < 1)))) {
    auVar91 = (undefined1  [16])0x0;
    if (&local_288 != top_blob) {
      piVar12 = top_blob->refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      local_288.data = top_blob->data;
      local_288.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_288.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_288.elemsize = top_blob->elemsize;
      local_288.elempack = top_blob->elempack;
      local_288.allocator = top_blob->allocator;
      auVar91._0_4_ = top_blob->dims;
      auVar91._4_4_ = top_blob->w;
      uVar9 = top_blob->h;
      uVar10 = top_blob->d;
      auVar91._8_8_ = CONCAT44(uVar10,uVar9);
      local_288.c = top_blob->c;
      local_288.cstep = top_blob->cstep;
      local_288.dims = auVar91._0_4_;
      local_288.w = auVar91._4_4_;
      local_288._48_8_ = auVar91._8_8_;
    }
    p_Var39 = (_func_int *)
              ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx +
              (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]);
    lVar42 = 8;
  }
  auVar118._8_8_ = 0;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar7;
  uStack_140 = 0;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar5;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar4;
  auVar112 = ZEXT864(uVar6);
  auVar148 = vpcmpeqd_avx(auVar91,auVar91);
  auVar91 = vpaddd_avx(auVar118,auVar148);
  auVar91 = vpmulld_avx(auVar107,auVar91);
  auVar91 = vpaddd_avx(auVar91,auVar110);
  auVar118 = vpaddd_avx(auVar73,auVar148);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar6;
  local_88 = vpmulld_avx(auVar118,auVar89);
  auVar91 = vpaddd_avx(local_88,auVar91);
  local_138 = vpsubd_avx(auVar91,auVar148);
  sVar47 = (uVar43 / uVar52) * (ulong)uVar31;
  _w = local_138._0_4_;
  _h = local_138._4_4_;
  local_150 = top_blob;
  local_148 = uVar3;
  iStack_144 = uVar8;
  Mat::create(&local_288,_w,_h,*(int *)(p_Var39 + 0xd0) / (int)uVar31,sVar47,uVar31,
              *(Allocator **)(&opt->lightmode + lVar42));
  iVar45 = iStack_144;
  iVar36 = local_148;
  if ((local_288.data == (void *)0x0) || ((long)local_288.c * local_288.cstep == 0)) {
    iVar48 = -100;
  }
  else {
    p_Var39 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
    iVar46 = *(int *)(&this->field_0x114 + (long)p_Var39);
    if ((uVar32 * iVar48 == iVar46) && (iVar46 == *(int *)(&this->field_0xd0 + (long)p_Var39))) {
      uVar31 = *(int *)(&this->field_0xd8 + (long)p_Var39) *
               *(int *)(&this->field_0xd4 + (long)p_Var39);
      local_158 = (ulong)uVar31;
      uVar2 = local_88._4_4_;
      if (iVar48 == 1) {
        if (0 < (int)uVar32) {
          local_220 = (Mat *)(local_288.cstep * local_288.elemsize);
          local_208 = local_288.data;
          pvVar13 = (this->weight_data_tm).data;
          iVar48 = bottom_blob->w;
          local_210 = bottom_blob->data;
          sVar47 = bottom_blob->elemsize;
          local_218 = bottom_blob->cstep * sVar47;
          auVar91 = vpcmpgtd_avx(local_138,(undefined1  [16])0x0);
          auVar91 = vpmovsxdq_avx(auVar91);
          uVar53 = vmovmskpd_avx(auVar91);
          uVar43 = 1;
          if (1 < (int)uVar32) {
            uVar43 = uVar41;
          }
          local_138._0_8_ = uVar43;
          local_148 = (int)((long)(int)uVar31 << 2);
          iStack_144 = (int)((ulong)((long)(int)uVar31 << 2) >> 0x20);
          iVar46 = -local_88._0_4_;
          local_2d0 = 0;
          do {
            if ((byte)((byte)uVar53 >> 1) != 0) {
              local_238 = (void *)(local_218 * local_2d0 + (long)local_210);
              pfVar44 = (float *)((long)local_220 * local_2d0 + (long)local_208);
              local_200 = this->_vptr_DeconvolutionDepthWise_x86_avx;
              iVar51 = 0;
              do {
                if ((uVar53 & 1) != 0) {
                  iVar33 = 0;
                  local_2b8 = iVar46;
                  do {
                    p_Var39 = local_200[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var39) == 0) {
                      auVar112 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar112 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var39) +
                                                  local_2d0 * 4));
                    }
                    auVar91 = auVar112._0_16_;
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var39)) {
                      iVar34 = 0;
                      do {
                        iVar35 = *(int *)(&this->field_0xe0 + (long)p_Var39) * iVar34 +
                                 (iVar51 - uVar2);
                        if (((-1 < iVar35) &&
                            (iVar37 = iVar35 / *(int *)(&this->field_0xe8 + (long)p_Var39),
                            iVar35 % *(int *)(&this->field_0xe8 + (long)p_Var39) == 0)) &&
                           (iVar37 < iVar45)) {
                          iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var39);
                          if (0 < (long)iVar35) {
                            lVar42 = 0;
                            iVar40 = local_2b8;
                            do {
                              if (((-1 < iVar40) &&
                                  (iVar38 = iVar40 / *(int *)(&this->field_0xe4 + (long)p_Var39),
                                  iVar40 % *(int *)(&this->field_0xe4 + (long)p_Var39) == 0)) &&
                                 (iVar38 < iVar36)) {
                                auVar112 = ZEXT464((uint)(*(float *)((long)pvVar13 +
                                                                    lVar42 * 4 +
                                                                    (ulong)(uint)(iVar35 * iVar34) *
                                                                    4) *
                                                          *(float *)((long)local_238 +
                                                                    (long)iVar38 * 4 +
                                                                    (long)iVar37 *
                                                                    (long)iVar48 * sVar47) +
                                                         auVar112._0_4_));
                              }
                              lVar42 = lVar42 + 1;
                              iVar40 = iVar40 + *(int *)(&this->field_0xdc + (long)p_Var39);
                            } while (iVar35 != lVar42);
                          }
                        }
                        auVar91 = auVar112._0_16_;
                        iVar34 = iVar34 + 1;
                      } while (iVar34 != *(int *)(&this->field_0xd8 + (long)p_Var39));
                    }
                    fVar106 = auVar91._0_4_;
                    fVar54 = fVar106;
                    switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var39)) {
                    case 1:
                      auVar91 = vmaxss_avx(auVar91,ZEXT416(0));
                      fVar54 = auVar91._0_4_;
                      break;
                    case 2:
                      auVar91 = vcmpss_avx(ZEXT816(0) << 0x40,auVar91,1);
                      auVar83._8_4_ = 0x3f800000;
                      auVar83._0_8_ = 0x3f8000003f800000;
                      auVar83._12_4_ = 0x3f800000;
                      auVar91 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var39
                                                                 )),auVar83,auVar91);
                      fVar54 = auVar91._0_4_ * fVar106;
                      break;
                    case 3:
                      fVar106 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var39))[1];
                      auVar91 = vmaxss_avx(auVar91,ZEXT416(**(uint **)(&this->field_0x120 +
                                                                      (long)p_Var39)));
                      fVar54 = auVar91._0_4_;
                      if (fVar106 < auVar91._0_4_) {
                        fVar54 = fVar106;
                      }
                      break;
                    case 4:
                      auVar91 = vminss_avx(auVar91,ZEXT416(0x42b0c0a5));
                      auVar148._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                      auVar148._8_4_ = auVar91._8_4_ ^ 0x80000000;
                      auVar148._12_4_ = auVar91._12_4_ ^ 0x80000000;
                      auVar91 = vcmpss_avx(auVar91,ZEXT416(0xc2b0c0a5),1);
                      auVar82._8_4_ = 0x42b0c0a5;
                      auVar82._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar82._12_4_ = 0x42b0c0a5;
                      auVar91 = vblendvps_avx(auVar148,auVar82,auVar91);
                      fVar54 = expf(auVar91._0_4_);
                      fVar54 = 1.0 / (fVar54 + 1.0);
                      break;
                    case 5:
                      fVar54 = expf(fVar106);
                      fVar54 = logf(fVar54 + 1.0);
                      fVar54 = tanhf(fVar54);
                      fVar54 = fVar54 * fVar106;
                      break;
                    case 6:
                      fVar15 = **(float **)(&this->field_0x120 + (long)p_Var39);
                      fVar16 = (*(float **)(&this->field_0x120 + (long)p_Var39))[1];
                      fVar60 = -fVar16 / fVar15;
                      fVar54 = 0.0;
                      if ((fVar60 <= fVar106) &&
                         (fVar54 = fVar106, fVar106 <= fVar60 + 1.0 / fVar15)) {
                        fVar54 = (fVar15 * fVar106 + fVar16) * fVar106;
                      }
                    }
                    *pfVar44 = fVar54;
                    pfVar44 = pfVar44 + 1;
                    iVar33 = iVar33 + 1;
                    local_2b8 = local_2b8 + 1;
                  } while (iVar33 != _w);
                }
                iVar51 = iVar51 + 1;
              } while (iVar51 != _h);
            }
            local_2d0 = local_2d0 + 1;
            pvVar13 = (void *)((long)pvVar13 + CONCAT44(iStack_144,local_148));
          } while (local_2d0 != local_138._0_8_);
        }
      }
      else {
        local_220 = bottom_blob;
        if (iVar48 == 4) {
          local_218 = uVar52;
          if (0 < (int)uVar32) {
            local_210 = (void *)CONCAT44(local_210._4_4_,uVar31 * 4);
            auVar91 = vpcmpgtd_avx(local_138,(undefined1  [16])0x0);
            auVar91 = vpmovsxdq_avx(auVar91);
            uVar32 = vmovmskpd_avx(auVar91);
            bVar30 = (byte)uVar32 >> 1;
            local_208 = (void *)CONCAT71(local_208._1_7_,bVar30);
            local_2e0 = 0;
            auVar113._8_4_ = 0x3f000000;
            auVar113._0_8_ = 0x3f0000003f000000;
            auVar113._12_4_ = 0x3f000000;
            auVar112 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            do {
              if (bVar30 != 0) {
                pvVar13 = (this->weight_data_tm).data;
                sVar47 = bottom_blob->elemsize;
                local_238 = (void *)(bottom_blob->cstep * local_2e0 * sVar47 +
                                    (long)bottom_blob->data);
                iVar48 = bottom_blob->w;
                pauVar49 = (undefined1 (*) [16])
                           (local_288.cstep * local_2e0 * local_288.elemsize + (long)local_288.data)
                ;
                local_200 = this->_vptr_DeconvolutionDepthWise_x86_avx;
                iVar36 = 0;
                do {
                  if ((uVar32 & 1) != 0) {
                    iVar45 = 0;
                    local_2c8 = -local_88._0_4_;
                    do {
                      p_Var39 = local_200[-3];
                      if (*(int *)(&this->field_0x10c + (long)p_Var39) == 0) {
                        auVar59 = ZEXT1664((undefined1  [16])0x0);
                      }
                      else {
                        auVar59 = ZEXT1664(*(undefined1 (*) [16])
                                            (*(long *)(&this->field_0x1b0 + (long)p_Var39) +
                                            local_2e0 * 0x10));
                      }
                      auVar66 = auVar59._0_16_;
                      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var39)) {
                        iVar51 = 0;
                        iVar46 = 0;
                        do {
                          iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var39) * iVar46 +
                                   (iVar36 - local_88._4_4_);
                          if (((-1 < iVar33) &&
                              (iVar34 = iVar33 / *(int *)(&this->field_0xe8 + (long)p_Var39),
                              iVar33 % *(int *)(&this->field_0xe8 + (long)p_Var39) == 0)) &&
                             (iVar34 < iStack_144)) {
                            lVar42 = (long)*(int *)(&this->field_0xd4 + (long)p_Var39);
                            if (0 < lVar42) {
                              uVar53 = *(int *)(&this->field_0xd4 + (long)p_Var39) * iVar51;
                              iVar33 = local_2c8;
                              do {
                                if (((-1 < iVar33) &&
                                    (iVar35 = iVar33 / *(int *)(&this->field_0xe4 + (long)p_Var39),
                                    iVar33 % *(int *)(&this->field_0xe4 + (long)p_Var39) == 0)) &&
                                   (iVar35 < local_148)) {
                                  pfVar44 = (float *)((long)pvVar13 +
                                                     (ulong)uVar53 * 4 +
                                                     (long)(int)(uVar31 * 4 * (int)local_2e0) * 4);
                                  pfVar1 = (float *)((long)local_238 +
                                                    (long)(iVar35 << 2) * 4 +
                                                    (long)iVar34 * (long)iVar48 * sVar47);
                                  auVar59 = ZEXT1664(CONCAT412(pfVar44[3] * pfVar1[3] +
                                                               auVar59._12_4_,
                                                               CONCAT48(pfVar44[2] * pfVar1[2] +
                                                                        auVar59._8_4_,
                                                                        CONCAT44(pfVar44[1] *
                                                                                 pfVar1[1] +
                                                                                 auVar59._4_4_,
                                                                                 *pfVar44 * *pfVar1
                                                                                 + auVar59._0_4_))))
                                  ;
                                }
                                uVar53 = uVar53 + 4;
                                iVar33 = iVar33 + *(int *)(&this->field_0xdc + (long)p_Var39);
                                lVar42 = lVar42 + -1;
                              } while (lVar42 != 0);
                            }
                          }
                          auVar66 = auVar59._0_16_;
                          iVar46 = iVar46 + 1;
                          iVar51 = iVar51 + 4;
                        } while (iVar46 != *(int *)(&this->field_0xd8 + (long)p_Var39));
                      }
                      auVar91 = auVar112._0_16_;
                      fVar54 = auVar112._0_4_;
                      fVar106 = auVar112._4_4_;
                      fVar15 = auVar112._8_4_;
                      fVar16 = auVar112._12_4_;
                      fVar60 = auVar66._4_4_;
                      fVar70 = auVar66._8_4_;
                      fVar71 = auVar66._12_4_;
                      switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var39)) {
                      case 1:
                        auVar66 = vmaxps_avx(auVar66,_DAT_00593030);
                        break;
                      case 2:
                        auVar91 = vmaxps_avx(auVar66,(undefined1  [16])0x0);
                        auVar118 = vminps_avx(auVar66,(undefined1  [16])0x0);
                        fVar54 = **(float **)(&this->field_0x120 + (long)p_Var39);
                        auVar66._0_4_ = fVar54 * auVar118._0_4_ + auVar91._0_4_;
                        auVar66._4_4_ = fVar54 * auVar118._4_4_ + auVar91._4_4_;
                        auVar66._8_4_ = fVar54 * auVar118._8_4_ + auVar91._8_4_;
                        auVar66._12_4_ = fVar54 * auVar118._12_4_ + auVar91._12_4_;
                        break;
                      case 3:
                        uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var39);
                        auVar124._4_4_ = uVar2;
                        auVar124._0_4_ = uVar2;
                        auVar124._8_4_ = uVar2;
                        auVar124._12_4_ = uVar2;
                        uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var39))[1];
                        auVar156._4_4_ = uVar2;
                        auVar156._0_4_ = uVar2;
                        auVar156._8_4_ = uVar2;
                        auVar156._12_4_ = uVar2;
                        auVar91 = vmaxps_avx(auVar66,auVar124);
                        auVar66 = vminps_avx(auVar156,auVar91);
                        break;
                      case 4:
                        auVar63._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
                        auVar63._8_4_ = -fVar70;
                        auVar63._12_4_ = -fVar71;
                        auVar79._8_4_ = 0x42b0c0a5;
                        auVar79._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar79._12_4_ = 0x42b0c0a5;
                        auVar118 = vminps_avx(auVar63,auVar79);
                        auVar80._8_4_ = 0xc2b0c0a5;
                        auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar80._12_4_ = 0xc2b0c0a5;
                        auVar73 = vmaxps_avx(auVar118,auVar80);
                        auVar125._0_4_ = auVar73._0_4_ * 1.442695 + 0.5;
                        auVar125._4_4_ = auVar73._4_4_ * 1.442695 + 0.5;
                        auVar125._8_4_ = auVar73._8_4_ * 1.442695 + 0.5;
                        auVar125._12_4_ = auVar73._12_4_ * 1.442695 + 0.5;
                        auVar157._0_4_ = (int)auVar125._0_4_;
                        auVar157._4_4_ = (int)auVar125._4_4_;
                        auVar157._8_4_ = (int)auVar125._8_4_;
                        auVar157._12_4_ = (int)auVar125._12_4_;
                        auVar148 = vcvtdq2ps_avx(auVar157);
                        auVar118 = vcmpps_avx(auVar125,auVar148,1);
                        auVar118 = vandps_avx(auVar118,auVar91);
                        auVar118 = vsubps_avx(auVar148,auVar118);
                        fVar60 = auVar118._0_4_ * -0.6931472 + auVar73._0_4_;
                        fVar70 = auVar118._4_4_ * -0.6931472 + auVar73._4_4_;
                        fVar71 = auVar118._8_4_ * -0.6931472 + auVar73._8_4_;
                        fVar72 = auVar118._12_4_ * -0.6931472 + auVar73._12_4_;
                        auVar126._0_4_ = (int)auVar118._0_4_;
                        auVar126._4_4_ = (int)auVar118._4_4_;
                        auVar126._8_4_ = (int)auVar118._8_4_;
                        auVar126._12_4_ = (int)auVar118._12_4_;
                        auVar118 = vpslld_avx(auVar126,0x17);
                        auVar118 = vpaddd_avx(auVar118,auVar91);
                        auVar64._0_4_ =
                             (fVar60 * fVar60 *
                              (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) *
                                 fVar60 + 0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) +
                             fVar60 + fVar54) * auVar118._0_4_ + fVar54;
                        auVar64._4_4_ =
                             (fVar70 * fVar70 *
                              (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) *
                                 fVar70 + 0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) +
                             fVar70 + fVar106) * auVar118._4_4_ + fVar106;
                        auVar64._8_4_ =
                             (fVar71 * fVar71 *
                              (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) *
                                 fVar71 + 0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) +
                             fVar71 + fVar15) * auVar118._8_4_ + fVar15;
                        auVar64._12_4_ =
                             (fVar72 * fVar72 *
                              (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) *
                                 fVar72 + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) +
                             fVar72 + fVar16) * auVar118._12_4_ + fVar16;
                        auVar118 = vrcpps_avx(auVar64);
                        fVar54 = auVar118._0_4_;
                        auVar65._0_4_ = auVar64._0_4_ * fVar54;
                        fVar106 = auVar118._4_4_;
                        auVar65._4_4_ = auVar64._4_4_ * fVar106;
                        fVar15 = auVar118._8_4_;
                        auVar65._8_4_ = auVar64._8_4_ * fVar15;
                        fVar16 = auVar118._12_4_;
                        auVar65._12_4_ = auVar64._12_4_ * fVar16;
                        auVar91 = vsubps_avx(auVar91,auVar65);
                        auVar66._0_4_ = fVar54 + fVar54 * auVar91._0_4_;
                        auVar66._4_4_ = fVar106 + fVar106 * auVar91._4_4_;
                        auVar66._8_4_ = fVar15 + fVar15 * auVar91._8_4_;
                        auVar66._12_4_ = fVar16 + fVar16 * auVar91._12_4_;
                        break;
                      case 5:
                        auVar108._8_4_ = 0x42b0c0a5;
                        auVar108._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar108._12_4_ = 0x42b0c0a5;
                        auVar118 = vminps_avx(auVar66,auVar108);
                        auVar142._8_4_ = 0xc2b0c0a5;
                        auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar142._12_4_ = 0xc2b0c0a5;
                        auVar73 = vmaxps_avx(auVar142,auVar118);
                        auVar147._0_4_ = auVar73._0_4_ * 1.442695 + 0.5;
                        auVar147._4_4_ = auVar73._4_4_ * 1.442695 + 0.5;
                        auVar147._8_4_ = auVar73._8_4_ * 1.442695 + 0.5;
                        auVar147._12_4_ = auVar73._12_4_ * 1.442695 + 0.5;
                        auVar154._0_4_ = (int)auVar147._0_4_;
                        auVar154._4_4_ = (int)auVar147._4_4_;
                        auVar154._8_4_ = (int)auVar147._8_4_;
                        auVar154._12_4_ = (int)auVar147._12_4_;
                        auVar148 = vcvtdq2ps_avx(auVar154);
                        auVar118 = vcmpps_avx(auVar147,auVar148,1);
                        auVar118 = vandps_avx(auVar118,auVar91);
                        auVar118 = vsubps_avx(auVar148,auVar118);
                        auVar155._0_4_ = auVar118._0_4_ * 0.6931472;
                        auVar155._4_4_ = auVar118._4_4_ * 0.6931472;
                        auVar155._8_4_ = auVar118._8_4_ * 0.6931472;
                        auVar155._12_4_ = auVar118._12_4_ * 0.6931472;
                        auVar148 = vsubps_avx(auVar73,auVar155);
                        fVar72 = auVar148._0_4_;
                        fVar116 = auVar148._4_4_;
                        fVar132 = auVar148._8_4_;
                        fVar134 = auVar148._12_4_;
                        auVar120._0_4_ = (int)auVar118._0_4_;
                        auVar120._4_4_ = (int)auVar118._4_4_;
                        auVar120._8_4_ = (int)auVar118._8_4_;
                        auVar120._12_4_ = (int)auVar118._12_4_;
                        auVar118 = vpslld_avx(auVar120,0x17);
                        auVar118 = vpaddd_avx(auVar118,auVar91);
                        auVar121._0_4_ =
                             (fVar72 + fVar54 +
                             fVar72 * fVar72 *
                             (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) *
                                fVar72 + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5)) *
                             auVar118._0_4_ + fVar54;
                        auVar121._4_4_ =
                             (fVar116 + fVar106 +
                             fVar116 * fVar116 *
                             (((((fVar116 * 0.00019875691 + 0.0013981999) * fVar116 + 0.008333452) *
                                fVar116 + 0.041665796) * fVar116 + 0.16666666) * fVar116 + 0.5)) *
                             auVar118._4_4_ + fVar106;
                        auVar121._8_4_ =
                             (fVar132 + fVar15 +
                             fVar132 * fVar132 *
                             (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                                fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) *
                             auVar118._8_4_ + fVar15;
                        auVar121._12_4_ =
                             (fVar134 + fVar16 +
                             fVar134 * fVar134 *
                             (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) *
                                fVar134 + 0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) *
                             auVar118._12_4_ + fVar16;
                        auVar74._8_4_ = 0x800000;
                        auVar74._0_8_ = 0x80000000800000;
                        auVar74._12_4_ = 0x800000;
                        auVar118 = vmaxps_avx(auVar121,auVar74);
                        auVar148 = vpsrld_avx(auVar118,0x17);
                        auVar93._8_4_ = 0xffffff82;
                        auVar93._0_8_ = 0xffffff82ffffff82;
                        auVar93._12_4_ = 0xffffff82;
                        auVar148 = vpaddd_avx(auVar148,auVar93);
                        auVar94._8_4_ = 0x807fffff;
                        auVar94._0_8_ = 0x807fffff807fffff;
                        auVar94._12_4_ = 0x807fffff;
                        auVar118 = vandps_avx(auVar118,auVar94);
                        auVar89 = vorps_avx(auVar118,auVar113);
                        auVar73 = vcvtdq2ps_avx(auVar148);
                        auVar95._8_4_ = 0x3f3504f3;
                        auVar95._0_8_ = 0x3f3504f33f3504f3;
                        auVar95._12_4_ = 0x3f3504f3;
                        auVar148 = vcmpps_avx(auVar89,auVar95,1);
                        auVar118 = vandps_avx(auVar148,auVar89);
                        fVar72 = auVar89._0_4_ + -1.0 + auVar118._0_4_;
                        fVar116 = auVar89._4_4_ + -1.0 + auVar118._4_4_;
                        fVar132 = auVar89._8_4_ + -1.0 + auVar118._8_4_;
                        fVar134 = auVar89._12_4_ + -1.0 + auVar118._12_4_;
                        auVar118 = vandps_avx(auVar148,auVar91);
                        auVar148 = vsubps_avx(auVar73,auVar118);
                        auVar118 = vcmpps_avx(auVar121,_DAT_00593030,2);
                        auVar75._0_4_ =
                             (fVar72 * fVar72 *
                              (((((((((fVar72 * 0.070376836 + -0.1151461) * fVar72 + 0.116769984) *
                                     fVar72 + -0.12420141) * fVar72 + 0.14249323) * fVar72 +
                                  -0.16668057) * fVar72 + 0.20000714) * fVar72 + -0.24999994) *
                                fVar72 + 0.3333333) * fVar72 + -0.5) +
                             auVar148._0_4_ * 0.6931472 + fVar72) * -2.0;
                        auVar75._4_4_ =
                             (fVar116 * fVar116 *
                              (((((((((fVar116 * 0.070376836 + -0.1151461) * fVar116 + 0.116769984)
                                     * fVar116 + -0.12420141) * fVar116 + 0.14249323) * fVar116 +
                                  -0.16668057) * fVar116 + 0.20000714) * fVar116 + -0.24999994) *
                                fVar116 + 0.3333333) * fVar116 + -0.5) +
                             auVar148._4_4_ * 0.6931472 + fVar116) * -2.0;
                        auVar75._8_4_ =
                             (fVar132 * fVar132 *
                              (((((((((fVar132 * 0.070376836 + -0.1151461) * fVar132 + 0.116769984)
                                     * fVar132 + -0.12420141) * fVar132 + 0.14249323) * fVar132 +
                                  -0.16668057) * fVar132 + 0.20000714) * fVar132 + -0.24999994) *
                                fVar132 + 0.3333333) * fVar132 + -0.5) +
                             auVar148._8_4_ * 0.6931472 + fVar132) * -2.0;
                        auVar75._12_4_ =
                             (fVar134 * fVar134 *
                              (((((((((fVar134 * 0.070376836 + -0.1151461) * fVar134 + 0.116769984)
                                     * fVar134 + -0.12420141) * fVar134 + 0.14249323) * fVar134 +
                                  -0.16668057) * fVar134 + 0.20000714) * fVar134 + -0.24999994) *
                                fVar134 + 0.3333333) * fVar134 + -0.5) +
                             auVar148._12_4_ * 0.6931472 + fVar134) * -2.0;
                        auVar96._8_4_ = 0x7fffffff;
                        auVar96._0_8_ = 0x7fffffff7fffffff;
                        auVar96._12_4_ = 0x7fffffff;
                        auVar118 = vblendvps_avx(auVar75,auVar96,auVar118);
                        auVar97._8_4_ = 0x42b0c0a5;
                        auVar97._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar97._12_4_ = 0x42b0c0a5;
                        auVar118 = vminps_avx(auVar118,auVar97);
                        auVar98._8_4_ = 0xc2b0c0a5;
                        auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar98._12_4_ = 0xc2b0c0a5;
                        auVar73 = vmaxps_avx(auVar118,auVar98);
                        auVar99._0_4_ = auVar73._0_4_ * 1.442695 + 0.5;
                        auVar99._4_4_ = auVar73._4_4_ * 1.442695 + 0.5;
                        auVar99._8_4_ = auVar73._8_4_ * 1.442695 + 0.5;
                        auVar99._12_4_ = auVar73._12_4_ * 1.442695 + 0.5;
                        auVar122._0_4_ = (int)auVar99._0_4_;
                        auVar122._4_4_ = (int)auVar99._4_4_;
                        auVar122._8_4_ = (int)auVar99._8_4_;
                        auVar122._12_4_ = (int)auVar99._12_4_;
                        auVar148 = vcvtdq2ps_avx(auVar122);
                        auVar118 = vcmpps_avx(auVar99,auVar148,1);
                        auVar118 = vandps_avx(auVar118,auVar91);
                        auVar118 = vsubps_avx(auVar148,auVar118);
                        auVar123._0_4_ = auVar118._0_4_ * 0.6931472;
                        auVar123._4_4_ = auVar118._4_4_ * 0.6931472;
                        auVar123._8_4_ = auVar118._8_4_ * 0.6931472;
                        auVar123._12_4_ = auVar118._12_4_ * 0.6931472;
                        auVar112 = ZEXT1664(auVar91);
                        auVar148 = vsubps_avx(auVar73,auVar123);
                        fVar72 = auVar148._0_4_;
                        fVar116 = auVar148._4_4_;
                        fVar132 = auVar148._8_4_;
                        fVar134 = auVar148._12_4_;
                        auVar100._0_4_ = (int)auVar118._0_4_;
                        auVar100._4_4_ = (int)auVar118._4_4_;
                        auVar100._8_4_ = (int)auVar118._8_4_;
                        auVar100._12_4_ = (int)auVar118._12_4_;
                        auVar118 = vpslld_avx(auVar100,0x17);
                        auVar91 = vpaddd_avx(auVar118,auVar91);
                        auVar76._0_4_ =
                             (fVar72 + fVar54 +
                             (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) *
                                fVar72 + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) *
                             fVar72 * fVar72) * auVar91._0_4_ + fVar54;
                        auVar76._4_4_ =
                             (fVar116 + fVar106 +
                             (((((fVar116 * 0.00019875691 + 0.0013981999) * fVar116 + 0.008333452) *
                                fVar116 + 0.041665796) * fVar116 + 0.16666666) * fVar116 + 0.5) *
                             fVar116 * fVar116) * auVar91._4_4_ + fVar106;
                        auVar76._8_4_ =
                             (fVar132 + fVar15 +
                             (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                                fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5) *
                             fVar132 * fVar132) * auVar91._8_4_ + fVar15;
                        auVar76._12_4_ =
                             (fVar134 + fVar16 +
                             (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) *
                                fVar134 + 0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5) *
                             fVar134 * fVar134) * auVar91._12_4_ + fVar16;
                        auVar91 = vrcpps_avx(auVar76);
                        fVar54 = auVar91._0_4_;
                        fVar106 = auVar91._4_4_;
                        fVar15 = auVar91._8_4_;
                        fVar16 = auVar91._12_4_;
                        auVar77._0_4_ = auVar76._0_4_ * (fVar54 + fVar54);
                        auVar77._4_4_ = auVar76._4_4_ * (fVar106 + fVar106);
                        auVar77._8_4_ = auVar76._8_4_ * (fVar15 + fVar15);
                        auVar77._12_4_ = auVar76._12_4_ * (fVar16 + fVar16);
                        auVar109._8_4_ = 0x40000000;
                        auVar109._0_8_ = 0x4000000040000000;
                        auVar109._12_4_ = 0x40000000;
                        auVar91 = vsubps_avx(auVar109,auVar77);
                        auVar78._0_4_ = fVar54 + fVar54 + -1.0 + fVar54 * auVar91._0_4_;
                        auVar78._4_4_ = fVar106 + fVar106 + -1.0 + fVar106 * auVar91._4_4_;
                        auVar78._8_4_ = fVar15 + fVar15 + -1.0 + fVar15 * auVar91._8_4_;
                        auVar78._12_4_ = fVar16 + fVar16 + -1.0 + fVar16 * auVar91._12_4_;
                        goto LAB_00456772;
                      case 6:
                        fVar54 = **(float **)(&this->field_0x120 + (long)p_Var39);
                        fVar106 = (*(float **)(&this->field_0x120 + (long)p_Var39))[1];
                        auVar81._0_4_ = fVar54 * auVar66._0_4_ + fVar106;
                        auVar81._4_4_ = fVar54 * fVar60 + fVar106;
                        auVar81._8_4_ = fVar54 * fVar70 + fVar106;
                        auVar81._12_4_ = fVar54 * fVar71 + fVar106;
                        auVar118 = vmaxps_avx(auVar81,_DAT_00593030);
                        auVar78 = vminps_avx(auVar118,auVar91);
LAB_00456772:
                        auVar66._0_4_ = auVar78._0_4_ * auVar66._0_4_;
                        auVar66._4_4_ = auVar78._4_4_ * fVar60;
                        auVar66._8_4_ = auVar78._8_4_ * fVar70;
                        auVar66._12_4_ = auVar78._12_4_ * fVar71;
                      }
                      *pauVar49 = auVar66;
                      pauVar49 = pauVar49 + 1;
                      iVar45 = iVar45 + 1;
                      local_2c8 = local_2c8 + 1;
                    } while (iVar45 != _w);
                  }
                  iVar36 = iVar36 + 1;
                } while (iVar36 != _h);
              }
              local_2e0 = local_2e0 + 1;
            } while (local_2e0 != uVar41);
          }
        }
        else if ((iVar48 == 8) && (local_218 = uVar52, 0 < (int)uVar32)) {
          local_210 = (void *)CONCAT44(local_210._4_4_,uVar31 * 8);
          auVar91 = vpcmpgtd_avx(local_138,(undefined1  [16])0x0);
          auVar91 = vpmovsxdq_avx(auVar91);
          uVar32 = vmovmskpd_avx(auVar91);
          bVar30 = (byte)uVar32 >> 1;
          local_208 = (void *)CONCAT71(local_208._1_7_,bVar30);
          local_2e0 = 0;
          auVar59 = ZEXT1664((undefined1  [16])0x0);
          auVar145 = ZEXT3264(CONCAT428(0x3f000000,
                                        CONCAT424(0x3f000000,
                                                  CONCAT420(0x3f000000,
                                                            CONCAT416(0x3f000000,
                                                                      CONCAT412(0x3f000000,
                                                                                CONCAT48(0x3f000000,
                                                                                                                                                                                  
                                                  0x3f0000003f000000)))))));
          auVar115 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar143._8_4_ = 0x42b0c0a5;
          auVar143._0_8_ = 0x42b0c0a542b0c0a5;
          auVar143._12_4_ = 0x42b0c0a5;
          auVar143._16_4_ = 0x42b0c0a5;
          auVar143._20_4_ = 0x42b0c0a5;
          auVar143._24_4_ = 0x42b0c0a5;
          auVar143._28_4_ = 0x42b0c0a5;
          auVar144._8_4_ = 0xc2b0c0a5;
          auVar144._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar144._12_4_ = 0xc2b0c0a5;
          auVar144._16_4_ = 0xc2b0c0a5;
          auVar144._20_4_ = 0xc2b0c0a5;
          auVar144._24_4_ = 0xc2b0c0a5;
          auVar144._28_4_ = 0xc2b0c0a5;
          do {
            if (bVar30 != 0) {
              pvVar13 = (this->weight_data_tm).data;
              sVar47 = bottom_blob->elemsize;
              local_238 = (void *)(bottom_blob->cstep * local_2e0 * sVar47 + (long)bottom_blob->data
                                  );
              iVar48 = bottom_blob->w;
              pauVar50 = (undefined1 (*) [32])
                         (local_288.cstep * local_2e0 * local_288.elemsize + (long)local_288.data);
              local_200 = this->_vptr_DeconvolutionDepthWise_x86_avx;
              iVar36 = 0;
              do {
                if ((uVar32 & 1) != 0) {
                  iVar45 = 0;
                  local_2c8 = -local_88._0_4_;
                  do {
                    p_Var39 = local_200[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var39) == 0) {
                      auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar151 = ZEXT3264(*(undefined1 (*) [32])
                                           (*(long *)(&this->field_0x1b0 + (long)p_Var39) +
                                           local_2e0 * 0x20));
                    }
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var39)) {
                      iVar46 = 0;
                      iVar51 = 0;
                      do {
                        iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var39) * iVar51 +
                                 (iVar36 - local_88._4_4_);
                        if (((-1 < iVar33) &&
                            (iVar34 = iVar33 / *(int *)(&this->field_0xe8 + (long)p_Var39),
                            iVar33 % *(int *)(&this->field_0xe8 + (long)p_Var39) == 0)) &&
                           (iVar34 < iStack_144)) {
                          lVar42 = (long)*(int *)(&this->field_0xd4 + (long)p_Var39);
                          if (0 < lVar42) {
                            uVar53 = *(int *)(&this->field_0xd4 + (long)p_Var39) * iVar46;
                            iVar33 = local_2c8;
                            do {
                              if (((-1 < iVar33) &&
                                  (iVar35 = iVar33 / *(int *)(&this->field_0xe4 + (long)p_Var39),
                                  iVar33 % *(int *)(&this->field_0xe4 + (long)p_Var39) == 0)) &&
                                 (iVar35 < local_148)) {
                                pfVar44 = (float *)((long)pvVar13 +
                                                   (ulong)uVar53 * 4 +
                                                   (long)(int)(uVar31 * 8 * (int)local_2e0) * 4);
                                pfVar1 = (float *)((long)local_238 +
                                                  (long)(iVar35 << 3) * 4 +
                                                  (long)iVar34 * (long)iVar48 * sVar47);
                                auVar151 = ZEXT3264(CONCAT428(auVar151._28_4_ + pfVar44[7],
                                                              CONCAT424(auVar151._24_4_ +
                                                                        pfVar44[6] * pfVar1[6],
                                                                        CONCAT420(auVar151._20_4_ +
                                                                                  pfVar44[5] *
                                                                                  pfVar1[5],
                                                                                  CONCAT416(auVar151
                                                  ._16_4_ + pfVar44[4] * pfVar1[4],
                                                  CONCAT412(auVar151._12_4_ + pfVar44[3] * pfVar1[3]
                                                            ,CONCAT48(auVar151._8_4_ +
                                                                      pfVar44[2] * pfVar1[2],
                                                                      CONCAT44(auVar151._4_4_ +
                                                                               pfVar44[1] *
                                                                               pfVar1[1],
                                                                               auVar151._0_4_ +
                                                                               *pfVar44 * *pfVar1)))
                                                  )))));
                              }
                              uVar53 = uVar53 + 8;
                              iVar33 = iVar33 + *(int *)(&this->field_0xdc + (long)p_Var39);
                              lVar42 = lVar42 + -1;
                            } while (lVar42 != 0);
                          }
                        }
                        iVar51 = iVar51 + 1;
                        iVar46 = iVar46 + 8;
                      } while (iVar51 != *(int *)(&this->field_0xd8 + (long)p_Var39));
                    }
                    auVar150 = auVar151._0_32_;
                    fVar117 = auVar151._8_4_;
                    fVar133 = auVar151._12_4_;
                    fVar135 = auVar151._16_4_;
                    fVar137 = auVar151._20_4_;
                    fVar139 = auVar151._24_4_;
                    fVar116 = auVar145._0_4_;
                    fVar132 = auVar145._4_4_;
                    fVar134 = auVar145._8_4_;
                    fVar136 = auVar145._12_4_;
                    fVar138 = auVar145._16_4_;
                    fVar140 = auVar145._20_4_;
                    fVar141 = auVar145._24_4_;
                    fVar146 = auVar145._28_4_;
                    auVar114 = auVar115._0_32_;
                    fVar54 = auVar115._0_4_;
                    fVar106 = auVar115._4_4_;
                    fVar15 = auVar115._8_4_;
                    fVar16 = auVar115._12_4_;
                    fVar60 = auVar115._16_4_;
                    fVar70 = auVar115._20_4_;
                    fVar71 = auVar115._24_4_;
                    fVar72 = auVar115._28_4_;
                    auVar152._28_36_ = auVar151._28_36_;
                    switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var39)) {
                    case 1:
                      auVar150 = vmaxps_avx(auVar150,auVar59._0_32_);
                      break;
                    case 2:
                      auVar114 = vmaxps_avx(auVar150,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      in_ZMM7 = ZEXT3264(auVar114);
                      auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar88 = vminps_avx(auVar150,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      fVar54 = **(float **)(&this->field_0x120 + (long)p_Var39);
                      auVar150._0_4_ = fVar54 * auVar88._0_4_ + auVar114._0_4_;
                      auVar150._4_4_ = fVar54 * auVar88._4_4_ + auVar114._4_4_;
                      auVar150._8_4_ = fVar54 * auVar88._8_4_ + auVar114._8_4_;
                      auVar150._12_4_ = fVar54 * auVar88._12_4_ + auVar114._12_4_;
                      auVar150._16_4_ = fVar54 * auVar88._16_4_ + auVar114._16_4_;
                      auVar150._20_4_ = fVar54 * auVar88._20_4_ + auVar114._20_4_;
                      auVar150._24_4_ = fVar54 * auVar88._24_4_ + auVar114._24_4_;
                      auVar150._28_4_ = auVar88._28_4_ + auVar114._28_4_;
                      break;
                    case 3:
                      uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var39);
                      auVar129._4_4_ = uVar2;
                      auVar129._0_4_ = uVar2;
                      auVar129._8_4_ = uVar2;
                      auVar129._12_4_ = uVar2;
                      auVar129._16_4_ = uVar2;
                      auVar129._20_4_ = uVar2;
                      auVar129._24_4_ = uVar2;
                      auVar129._28_4_ = uVar2;
                      uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var39))[1];
                      auVar158._4_4_ = uVar2;
                      auVar158._0_4_ = uVar2;
                      auVar158._8_4_ = uVar2;
                      auVar158._12_4_ = uVar2;
                      auVar158._16_4_ = uVar2;
                      auVar158._20_4_ = uVar2;
                      auVar158._24_4_ = uVar2;
                      auVar158._28_4_ = uVar2;
                      auVar150 = vmaxps_avx(auVar150,auVar129);
                      in_ZMM7 = ZEXT3264(auVar150);
                      auVar150 = vminps_avx(auVar158,auVar150);
                      break;
                    case 4:
                      auVar130._0_8_ = auVar151._0_8_ ^ 0x8000000080000000;
                      auVar130._8_4_ = -fVar117;
                      auVar130._12_4_ = -fVar133;
                      auVar130._16_4_ = -fVar135;
                      auVar130._20_4_ = -fVar137;
                      auVar130._24_4_ = -fVar139;
                      auVar130._28_4_ = -auVar151._28_4_;
                      auVar68._8_4_ = 0x42b0c0a5;
                      auVar68._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar68._12_4_ = 0x42b0c0a5;
                      auVar68._16_4_ = 0x42b0c0a5;
                      auVar68._20_4_ = 0x42b0c0a5;
                      auVar68._24_4_ = 0x42b0c0a5;
                      auVar68._28_4_ = 0x42b0c0a5;
                      auVar150 = vminps_avx(auVar130,auVar68);
                      auVar69._8_4_ = 0xc2b0c0a5;
                      auVar69._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar69._12_4_ = 0xc2b0c0a5;
                      auVar69._16_4_ = 0xc2b0c0a5;
                      auVar69._20_4_ = 0xc2b0c0a5;
                      auVar69._24_4_ = 0xc2b0c0a5;
                      auVar69._28_4_ = 0xc2b0c0a5;
                      auVar88 = vmaxps_avx(auVar150,auVar69);
                      auVar149._0_4_ = auVar88._0_4_ * 1.442695 + fVar116;
                      auVar149._4_4_ = auVar88._4_4_ * 1.442695 + fVar132;
                      auVar149._8_4_ = auVar88._8_4_ * 1.442695 + fVar134;
                      auVar149._12_4_ = auVar88._12_4_ * 1.442695 + fVar136;
                      auVar149._16_4_ = auVar88._16_4_ * 1.442695 + fVar138;
                      auVar149._20_4_ = auVar88._20_4_ * 1.442695 + fVar140;
                      auVar149._24_4_ = auVar88._24_4_ * 1.442695 + fVar141;
                      auVar149._28_4_ = auVar151._28_4_ + fVar146;
                      auVar105 = vroundps_avx(auVar149,1);
                      auVar150 = vcmpps_avx(auVar149,auVar105,1);
                      auVar150 = vandps_avx(auVar150,auVar114);
                      auVar150 = vsubps_avx(auVar105,auVar150);
                      fVar117 = auVar150._0_4_ * -0.6931472 + auVar88._0_4_;
                      fVar133 = auVar150._4_4_ * -0.6931472 + auVar88._4_4_;
                      fVar135 = auVar150._8_4_ * -0.6931472 + auVar88._8_4_;
                      fVar137 = auVar150._12_4_ * -0.6931472 + auVar88._12_4_;
                      fVar139 = auVar150._16_4_ * -0.6931472 + auVar88._16_4_;
                      fVar153 = auVar150._20_4_ * -0.6931472 + auVar88._20_4_;
                      fVar159 = auVar150._24_4_ * -0.6931472 + auVar88._24_4_;
                      auVar119._0_4_ = (int)auVar150._0_4_;
                      auVar119._4_4_ = (int)auVar150._4_4_;
                      auVar119._8_4_ = (int)auVar150._8_4_;
                      auVar119._12_4_ = (int)auVar150._12_4_;
                      auVar131._16_4_ = (int)auVar150._16_4_;
                      auVar131._0_16_ = auVar119;
                      auVar131._20_4_ = (int)auVar150._20_4_;
                      auVar131._24_4_ = (int)auVar150._24_4_;
                      auVar131._28_4_ = (int)auVar150._28_4_;
                      auVar118 = vpslld_avx(auVar119,0x17);
                      auVar91 = vpslld_avx(auVar131._16_16_,0x17);
                      auVar62._8_4_ = 0x3f800000;
                      auVar62._0_8_ = 0x3f8000003f800000;
                      auVar62._12_4_ = 0x3f800000;
                      auVar91 = vpaddd_avx(auVar91,auVar62);
                      auVar118 = vpaddd_avx(auVar118,auVar62);
                      auVar87._0_4_ =
                           (fVar117 + fVar54 +
                           fVar117 * fVar117 *
                           (fVar116 +
                           ((((fVar117 * 0.00019875691 + 0.0013981999) * fVar117 + 0.008333452) *
                             fVar117 + 0.041665796) * fVar117 + 0.16666666) * fVar117)) *
                           auVar118._0_4_ + fVar54;
                      auVar87._4_4_ =
                           (fVar133 + fVar106 +
                           fVar133 * fVar133 *
                           (fVar132 +
                           ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) *
                             fVar133 + 0.041665796) * fVar133 + 0.16666666) * fVar133)) *
                           auVar118._4_4_ + fVar106;
                      auVar87._8_4_ =
                           (fVar135 + fVar15 +
                           fVar135 * fVar135 *
                           (fVar134 +
                           ((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) *
                             fVar135 + 0.041665796) * fVar135 + 0.16666666) * fVar135)) *
                           auVar118._8_4_ + fVar15;
                      auVar87._12_4_ =
                           (fVar137 + fVar16 +
                           fVar137 * fVar137 *
                           (fVar136 +
                           ((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) *
                             fVar137 + 0.041665796) * fVar137 + 0.16666666) * fVar137)) *
                           auVar118._12_4_ + fVar16;
                      auVar87._16_4_ =
                           (fVar139 + fVar60 +
                           fVar139 * fVar139 *
                           (fVar138 +
                           ((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) *
                             fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139)) *
                           auVar91._0_4_ + fVar60;
                      auVar87._20_4_ =
                           (fVar153 + fVar70 +
                           fVar153 * fVar153 *
                           (fVar140 +
                           ((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 + 0.008333452) *
                             fVar153 + 0.041665796) * fVar153 + 0.16666666) * fVar153)) *
                           auVar91._4_4_ + fVar70;
                      auVar87._24_4_ =
                           (fVar159 + fVar71 +
                           fVar159 * fVar159 *
                           (fVar141 +
                           ((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) *
                             fVar159 + 0.041665796) * fVar159 + 0.16666666) * fVar159)) *
                           auVar91._8_4_ + fVar71;
                      auVar87._28_4_ =
                           auVar105._28_4_ + auVar88._28_4_ + fVar72 + fVar146 + -0.47508308 +
                           fVar72;
                      auVar88 = vrcpps_avx(auVar87);
                      in_ZMM7 = ZEXT3264(auVar88);
                      fVar54 = auVar88._0_4_;
                      fVar106 = auVar88._4_4_;
                      auVar20._4_4_ = auVar87._4_4_ * fVar106;
                      auVar20._0_4_ = auVar87._0_4_ * fVar54;
                      fVar15 = auVar88._8_4_;
                      auVar20._8_4_ = auVar87._8_4_ * fVar15;
                      fVar16 = auVar88._12_4_;
                      auVar20._12_4_ = auVar87._12_4_ * fVar16;
                      fVar60 = auVar88._16_4_;
                      auVar20._16_4_ = auVar87._16_4_ * fVar60;
                      fVar70 = auVar88._20_4_;
                      auVar20._20_4_ = auVar87._20_4_ * fVar70;
                      fVar71 = auVar88._24_4_;
                      auVar20._24_4_ = auVar87._24_4_ * fVar71;
                      auVar20._28_4_ = auVar87._28_4_;
                      auVar114 = vsubps_avx(auVar114,auVar20);
                      auVar150._0_4_ = fVar54 + fVar54 * auVar114._0_4_;
                      auVar150._4_4_ = fVar106 + fVar106 * auVar114._4_4_;
                      auVar150._8_4_ = fVar15 + fVar15 * auVar114._8_4_;
                      auVar150._12_4_ = fVar16 + fVar16 * auVar114._12_4_;
                      auVar150._16_4_ = fVar60 + fVar60 * auVar114._16_4_;
                      auVar150._20_4_ = fVar70 + fVar70 * auVar114._20_4_;
                      auVar150._24_4_ = fVar71 + fVar71 * auVar114._24_4_;
                      auVar150._28_4_ = auVar88._28_4_ + auVar114._28_4_;
                      break;
                    case 5:
                      auVar150 = vminps_avx(auVar150,auVar143);
                      auVar88 = vmaxps_avx(auVar144,auVar150);
                      auVar127._0_4_ = fVar116 + auVar88._0_4_ * 1.442695;
                      auVar127._4_4_ = fVar132 + auVar88._4_4_ * 1.442695;
                      auVar127._8_4_ = fVar134 + auVar88._8_4_ * 1.442695;
                      auVar127._12_4_ = fVar136 + auVar88._12_4_ * 1.442695;
                      auVar127._16_4_ = fVar138 + auVar88._16_4_ * 1.442695;
                      auVar127._20_4_ = fVar140 + auVar88._20_4_ * 1.442695;
                      auVar127._24_4_ = fVar141 + auVar88._24_4_ * 1.442695;
                      auVar127._28_4_ = fVar146 + in_ZMM7._28_4_;
                      auVar105 = vroundps_avx(auVar127,1);
                      auVar150 = vcmpps_avx(auVar127,auVar105,1);
                      auVar150 = vandps_avx(auVar150,auVar114);
                      auVar150 = vsubps_avx(auVar105,auVar150);
                      auVar17._4_4_ = auVar150._4_4_ * 0.6931472;
                      auVar17._0_4_ = auVar150._0_4_ * 0.6931472;
                      auVar17._8_4_ = auVar150._8_4_ * 0.6931472;
                      auVar17._12_4_ = auVar150._12_4_ * 0.6931472;
                      auVar17._16_4_ = auVar150._16_4_ * 0.6931472;
                      auVar17._20_4_ = auVar150._20_4_ * 0.6931472;
                      auVar17._24_4_ = auVar150._24_4_ * 0.6931472;
                      auVar17._28_4_ = auVar105._28_4_;
                      auVar88 = vsubps_avx(auVar88,auVar17);
                      fVar153 = auVar88._0_4_;
                      fVar159 = auVar88._4_4_;
                      fVar160 = auVar88._8_4_;
                      fVar161 = auVar88._12_4_;
                      fVar162 = auVar88._16_4_;
                      fVar163 = auVar88._20_4_;
                      fVar164 = auVar88._24_4_;
                      auVar90._0_4_ = (int)auVar150._0_4_;
                      auVar90._4_4_ = (int)auVar150._4_4_;
                      auVar90._8_4_ = (int)auVar150._8_4_;
                      auVar90._12_4_ = (int)auVar150._12_4_;
                      auVar101._16_4_ = (int)auVar150._16_4_;
                      auVar101._0_16_ = auVar90;
                      auVar101._20_4_ = (int)auVar150._20_4_;
                      auVar101._24_4_ = (int)auVar150._24_4_;
                      auVar101._28_4_ = (int)auVar150._28_4_;
                      auVar118 = vpslld_avx(auVar90,0x17);
                      auVar91 = vpslld_avx(auVar101._16_16_,0x17);
                      auVar111._8_4_ = 0x3f800000;
                      auVar111._0_8_ = 0x3f8000003f800000;
                      auVar111._12_4_ = 0x3f800000;
                      auVar91 = vpaddd_avx(auVar91,auVar111);
                      auVar118 = vpaddd_avx(auVar118,auVar111);
                      auVar128._0_4_ =
                           (fVar153 + fVar54 +
                           fVar153 * fVar153 *
                           (((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 + 0.008333452) *
                              fVar153 + 0.041665796) * fVar153 + 0.16666666) * fVar153 + fVar116)) *
                           auVar118._0_4_ + fVar54;
                      auVar128._4_4_ =
                           (fVar159 + fVar106 +
                           fVar159 * fVar159 *
                           (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) *
                              fVar159 + 0.041665796) * fVar159 + 0.16666666) * fVar159 + fVar132)) *
                           auVar118._4_4_ + fVar106;
                      auVar128._8_4_ =
                           (fVar160 + fVar15 +
                           fVar160 * fVar160 *
                           (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) *
                              fVar160 + 0.041665796) * fVar160 + 0.16666666) * fVar160 + fVar134)) *
                           auVar118._8_4_ + fVar15;
                      auVar128._12_4_ =
                           (fVar161 + fVar16 +
                           fVar161 * fVar161 *
                           (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) *
                              fVar161 + 0.041665796) * fVar161 + 0.16666666) * fVar161 + fVar136)) *
                           auVar118._12_4_ + fVar16;
                      auVar128._16_4_ =
                           (fVar162 + fVar60 +
                           fVar162 * fVar162 *
                           (((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 + 0.008333452) *
                              fVar162 + 0.041665796) * fVar162 + 0.16666666) * fVar162 + fVar138)) *
                           auVar91._0_4_ + fVar60;
                      auVar128._20_4_ =
                           (fVar163 + fVar70 +
                           fVar163 * fVar163 *
                           (((((fVar163 * 0.00019875691 + 0.0013981999) * fVar163 + 0.008333452) *
                              fVar163 + 0.041665796) * fVar163 + 0.16666666) * fVar163 + fVar140)) *
                           auVar91._4_4_ + fVar70;
                      auVar128._24_4_ =
                           (fVar164 + fVar71 +
                           fVar164 * fVar164 *
                           (((((fVar164 * 0.00019875691 + 0.0013981999) * fVar164 + 0.008333452) *
                              fVar164 + 0.041665796) * fVar164 + 0.16666666) * fVar164 + fVar141)) *
                           auVar91._8_4_ + fVar71;
                      auVar128._28_4_ =
                           auVar88._28_4_ + fVar72 +
                           auVar112._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                           fVar146 + fVar72;
                      auVar56._8_4_ = 0x800000;
                      auVar56._0_8_ = 0x80000000800000;
                      auVar56._12_4_ = 0x800000;
                      auVar56._16_4_ = 0x800000;
                      auVar56._20_4_ = 0x800000;
                      auVar56._24_4_ = 0x800000;
                      auVar56._28_4_ = 0x800000;
                      auVar105 = vmaxps_avx(auVar128,auVar56);
                      auVar91 = vpsrld_avx(auVar105._16_16_,0x17);
                      auVar57._8_4_ = 0x807fffff;
                      auVar57._0_8_ = 0x807fffff807fffff;
                      auVar57._12_4_ = 0x807fffff;
                      auVar57._16_4_ = 0x807fffff;
                      auVar57._20_4_ = 0x807fffff;
                      auVar57._24_4_ = 0x807fffff;
                      auVar57._28_4_ = 0x807fffff;
                      auVar150 = vandps_avx(auVar105,auVar57);
                      auVar17 = vorps_avx(auVar150,auVar145._0_32_);
                      auVar58._8_4_ = 0x3f3504f3;
                      auVar58._0_8_ = 0x3f3504f33f3504f3;
                      auVar58._12_4_ = 0x3f3504f3;
                      auVar58._16_4_ = 0x3f3504f3;
                      auVar58._20_4_ = 0x3f3504f3;
                      auVar58._24_4_ = 0x3f3504f3;
                      auVar58._28_4_ = 0x3f3504f3;
                      auVar88 = vcmpps_avx(auVar58,auVar17,2);
                      auVar150 = vandnps_avx(auVar88,auVar17);
                      fVar153 = auVar17._0_4_ + -1.0 + auVar150._0_4_;
                      fVar159 = auVar17._4_4_ + -1.0 + auVar150._4_4_;
                      fVar160 = auVar17._8_4_ + -1.0 + auVar150._8_4_;
                      fVar161 = auVar17._12_4_ + -1.0 + auVar150._12_4_;
                      fVar162 = auVar17._16_4_ + -1.0 + auVar150._16_4_;
                      fVar163 = auVar17._20_4_ + -1.0 + auVar150._20_4_;
                      fVar164 = auVar17._24_4_ + -1.0 + auVar150._24_4_;
                      auVar91 = vpsubd_avx(auVar91,auVar88._16_16_);
                      auVar118 = vpsrld_avx(auVar105._0_16_,0x17);
                      auVar55._8_4_ = 0xffffff81;
                      auVar55._0_8_ = 0xffffff81ffffff81;
                      auVar55._12_4_ = 0xffffff81;
                      auVar91 = vpaddd_avx(auVar91,auVar55);
                      auVar118 = vpsubd_avx(auVar118,auVar88._0_16_);
                      auVar118 = vpaddd_avx(auVar118,auVar55);
                      auVar85._16_16_ = auVar91;
                      auVar85._0_16_ = auVar118;
                      auVar59 = ZEXT864(0) << 0x20;
                      auVar88 = vcmpps_avx(auVar128,ZEXT832(0) << 0x20,2);
                      auVar105 = vcvtdq2ps_avx(auVar85);
                      auVar18._4_4_ =
                           (fVar159 + auVar105._4_4_ * 0.6931472 +
                           fVar159 * fVar159 *
                           (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * (
                                                  fVar159 * (fVar159 * (fVar159 * 0.070376836 +
                                                                       -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                           -2.0;
                      auVar18._0_4_ =
                           (fVar153 + auVar105._0_4_ * 0.6931472 +
                           fVar153 * fVar153 *
                           (fVar153 * (fVar153 * (fVar153 * (fVar153 * (fVar153 * (fVar153 * (
                                                  fVar153 * (fVar153 * (fVar153 * 0.070376836 +
                                                                       -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                           -2.0;
                      auVar18._8_4_ =
                           (fVar160 + auVar105._8_4_ * 0.6931472 +
                           fVar160 * fVar160 *
                           (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (
                                                  fVar160 * (fVar160 * (fVar160 * 0.070376836 +
                                                                       -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                           -2.0;
                      auVar18._12_4_ =
                           (fVar161 + auVar105._12_4_ * 0.6931472 +
                           fVar161 * fVar161 *
                           (fVar161 * (fVar161 * (fVar161 * (fVar161 * (fVar161 * (fVar161 * (
                                                  fVar161 * (fVar161 * (fVar161 * 0.070376836 +
                                                                       -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                           -2.0;
                      auVar18._16_4_ =
                           (fVar162 + auVar105._16_4_ * 0.6931472 +
                           fVar162 * fVar162 *
                           (fVar162 * (fVar162 * (fVar162 * (fVar162 * (fVar162 * (fVar162 * (
                                                  fVar162 * (fVar162 * (fVar162 * 0.070376836 +
                                                                       -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                           -2.0;
                      auVar18._20_4_ =
                           (fVar163 + auVar105._20_4_ * 0.6931472 +
                           fVar163 * fVar163 *
                           (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (
                                                  fVar163 * (fVar163 * (fVar163 * 0.070376836 +
                                                                       -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                           -2.0;
                      auVar18._24_4_ =
                           (fVar164 + auVar105._24_4_ * 0.6931472 +
                           fVar164 * fVar164 *
                           (fVar164 * (fVar164 * (fVar164 * (fVar164 * (fVar164 * (fVar164 * (
                                                  fVar164 * (fVar164 * (fVar164 * 0.070376836 +
                                                                       -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                           -2.0;
                      auVar18._28_4_ =
                           auVar17._28_4_ + -1.0 + auVar150._28_4_ + auVar105._28_4_ + 0.0;
                      auVar102._8_4_ = 0x7fffffff;
                      auVar102._0_8_ = 0x7fffffff7fffffff;
                      auVar102._12_4_ = 0x7fffffff;
                      auVar102._16_4_ = 0x7fffffff;
                      auVar102._20_4_ = 0x7fffffff;
                      auVar102._24_4_ = 0x7fffffff;
                      auVar102._28_4_ = 0x7fffffff;
                      auVar150 = vblendvps_avx(auVar18,auVar102,auVar88);
                      auVar150 = vminps_avx(auVar143,auVar150);
                      auVar88 = vmaxps_avx(auVar144,auVar150);
                      auVar103._0_4_ = auVar88._0_4_ * 1.442695 + fVar116;
                      auVar103._4_4_ = auVar88._4_4_ * 1.442695 + fVar132;
                      auVar103._8_4_ = auVar88._8_4_ * 1.442695 + fVar134;
                      auVar103._12_4_ = auVar88._12_4_ * 1.442695 + fVar136;
                      auVar103._16_4_ = auVar88._16_4_ * 1.442695 + fVar138;
                      auVar103._20_4_ = auVar88._20_4_ * 1.442695 + fVar140;
                      auVar103._24_4_ = auVar88._24_4_ * 1.442695 + fVar141;
                      auVar103._28_4_ = fVar146 + NAN;
                      auVar105 = vroundps_avx(auVar103,1);
                      auVar150 = vcmpps_avx(auVar103,auVar105,1);
                      auVar150 = vandps_avx(auVar150,auVar114);
                      auVar150 = vsubps_avx(auVar105,auVar150);
                      auVar19._4_4_ = auVar150._4_4_ * 0.6931472;
                      auVar19._0_4_ = auVar150._0_4_ * 0.6931472;
                      auVar19._8_4_ = auVar150._8_4_ * 0.6931472;
                      auVar19._12_4_ = auVar150._12_4_ * 0.6931472;
                      auVar19._16_4_ = auVar150._16_4_ * 0.6931472;
                      auVar19._20_4_ = auVar150._20_4_ * 0.6931472;
                      auVar19._24_4_ = auVar150._24_4_ * 0.6931472;
                      auVar19._28_4_ = auVar105._28_4_;
                      auVar88 = vsubps_avx(auVar88,auVar19);
                      fVar153 = auVar88._0_4_;
                      fVar159 = auVar88._4_4_;
                      fVar160 = auVar88._8_4_;
                      fVar161 = auVar88._12_4_;
                      fVar162 = auVar88._16_4_;
                      fVar163 = auVar88._20_4_;
                      fVar164 = auVar88._24_4_;
                      auVar115 = ZEXT3264(auVar114);
                      auVar145 = ZEXT3264(auVar145._0_32_);
                      fVar116 = fVar116 + ((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 +
                                            0.008333452) * fVar153 + 0.041665796) * fVar153 +
                                          0.16666666) * fVar153;
                      fVar132 = fVar132 + ((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 +
                                            0.008333452) * fVar159 + 0.041665796) * fVar159 +
                                          0.16666666) * fVar159;
                      fVar134 = fVar134 + ((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 +
                                            0.008333452) * fVar160 + 0.041665796) * fVar160 +
                                          0.16666666) * fVar160;
                      fVar136 = fVar136 + ((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 +
                                            0.008333452) * fVar161 + 0.041665796) * fVar161 +
                                          0.16666666) * fVar161;
                      fVar138 = fVar138 + ((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 +
                                            0.008333452) * fVar162 + 0.041665796) * fVar162 +
                                          0.16666666) * fVar162;
                      fVar140 = fVar140 + ((((fVar163 * 0.00019875691 + 0.0013981999) * fVar163 +
                                            0.008333452) * fVar163 + 0.041665796) * fVar163 +
                                          0.16666666) * fVar163;
                      fVar141 = fVar141 + ((((fVar164 * 0.00019875691 + 0.0013981999) * fVar164 +
                                            0.008333452) * fVar164 + 0.041665796) * fVar164 +
                                          0.16666666) * fVar164;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar146 + auVar128._28_4_ + 0.0013981999 +
                                                             0.008333452 + 0.041665796 + 0.16666666,
                                                   CONCAT424(fVar141,CONCAT420(fVar140,CONCAT416(
                                                  fVar138,CONCAT412(fVar136,CONCAT48(fVar134,
                                                  CONCAT44(fVar132,fVar116))))))));
                      auVar92._0_4_ = (int)auVar150._0_4_;
                      auVar92._4_4_ = (int)auVar150._4_4_;
                      auVar92._8_4_ = (int)auVar150._8_4_;
                      auVar92._12_4_ = (int)auVar150._12_4_;
                      auVar104._16_4_ = (int)auVar150._16_4_;
                      auVar104._0_16_ = auVar92;
                      auVar104._20_4_ = (int)auVar150._20_4_;
                      auVar104._24_4_ = (int)auVar150._24_4_;
                      auVar104._28_4_ = (int)auVar150._28_4_;
                      auVar118 = vpslld_avx(auVar92,0x17);
                      auVar91 = vpslld_avx(auVar104._16_16_,0x17);
                      auVar61._8_4_ = 0x3f800000;
                      auVar61._0_8_ = 0x3f8000003f800000;
                      auVar61._12_4_ = 0x3f800000;
                      auVar91 = vpaddd_avx(auVar91,auVar61);
                      auVar118 = vpaddd_avx(auVar118,auVar61);
                      auVar86._0_4_ =
                           (fVar153 + fVar54 + fVar153 * fVar153 * fVar116) * auVar118._0_4_ +
                           fVar54;
                      auVar86._4_4_ =
                           (fVar159 + fVar106 + fVar159 * fVar159 * fVar132) * auVar118._4_4_ +
                           fVar106;
                      auVar86._8_4_ =
                           (fVar160 + fVar15 + fVar160 * fVar160 * fVar134) * auVar118._8_4_ +
                           fVar15;
                      auVar86._12_4_ =
                           (fVar161 + fVar16 + fVar161 * fVar161 * fVar136) * auVar118._12_4_ +
                           fVar16;
                      auVar86._16_4_ =
                           (fVar162 + fVar60 + fVar162 * fVar162 * fVar138) * auVar91._0_4_ + fVar60
                      ;
                      auVar86._20_4_ =
                           (fVar163 + fVar70 + fVar163 * fVar163 * fVar140) * auVar91._4_4_ + fVar70
                      ;
                      auVar86._24_4_ =
                           (fVar164 + fVar71 + fVar164 * fVar164 * fVar141) * auVar91._8_4_ + fVar71
                      ;
                      auVar86._28_4_ = auVar88._28_4_ + fVar72 + auVar105._28_4_ + fVar72;
                      auVar150 = vrcpps_avx(auVar86);
                      fVar54 = auVar150._0_4_;
                      fVar106 = auVar150._4_4_;
                      fVar15 = auVar150._8_4_;
                      fVar16 = auVar150._12_4_;
                      fVar60 = auVar150._16_4_;
                      fVar70 = auVar150._20_4_;
                      fVar71 = auVar150._24_4_;
                      auVar114._4_4_ = auVar86._4_4_ * (fVar106 + fVar106);
                      auVar114._0_4_ = auVar86._0_4_ * (fVar54 + fVar54);
                      auVar114._8_4_ = auVar86._8_4_ * (fVar15 + fVar15);
                      auVar114._12_4_ = auVar86._12_4_ * (fVar16 + fVar16);
                      auVar114._16_4_ = auVar86._16_4_ * (fVar60 + fVar60);
                      auVar114._20_4_ = auVar86._20_4_ * (fVar70 + fVar70);
                      auVar114._24_4_ = auVar86._24_4_ * (fVar71 + fVar71);
                      auVar114._28_4_ = auVar86._28_4_;
                      auVar67._8_4_ = 0x40000000;
                      auVar67._0_8_ = 0x4000000040000000;
                      auVar67._12_4_ = 0x40000000;
                      auVar67._16_4_ = 0x40000000;
                      auVar67._20_4_ = 0x40000000;
                      auVar67._24_4_ = 0x40000000;
                      auVar67._28_4_ = 0x40000000;
                      auVar114 = vsubps_avx(auVar67,auVar114);
                      auVar105._0_4_ = fVar54 + fVar54 + -1.0;
                      auVar105._4_4_ = fVar106 + fVar106 + -1.0;
                      auVar105._8_4_ = fVar15 + fVar15 + -1.0;
                      auVar105._12_4_ = fVar16 + fVar16 + -1.0;
                      auVar105._16_4_ = fVar60 + fVar60 + -1.0;
                      auVar105._20_4_ = fVar70 + fVar70 + -1.0;
                      auVar105._24_4_ = fVar71 + fVar71 + -1.0;
                      auVar105._28_4_ = auVar150._28_4_ + auVar150._28_4_ + -1.0;
                      auVar84._0_4_ = auVar105._0_4_ + fVar54 * auVar114._0_4_;
                      auVar84._4_4_ = auVar105._4_4_ + fVar106 * auVar114._4_4_;
                      auVar84._8_4_ = auVar105._8_4_ + fVar15 * auVar114._8_4_;
                      auVar84._12_4_ = auVar105._12_4_ + fVar16 * auVar114._12_4_;
                      auVar84._16_4_ = auVar105._16_4_ + fVar60 * auVar114._16_4_;
                      auVar84._20_4_ = auVar105._20_4_ + fVar70 * auVar114._20_4_;
                      auVar84._24_4_ = auVar105._24_4_ + fVar71 * auVar114._24_4_;
                      goto LAB_00456051;
                    case 6:
                      fVar54 = **(float **)(&this->field_0x120 + (long)p_Var39);
                      fVar106 = (*(float **)(&this->field_0x120 + (long)p_Var39))[1];
                      auVar105._4_4_ = fVar106;
                      auVar105._0_4_ = fVar106;
                      auVar105._8_4_ = fVar106;
                      auVar105._12_4_ = fVar106;
                      auVar105._16_4_ = fVar106;
                      auVar105._20_4_ = fVar106;
                      auVar105._24_4_ = fVar106;
                      auVar105._28_4_ = fVar106;
                      auVar88._0_4_ = auVar151._0_4_ * fVar54 + fVar106;
                      auVar88._4_4_ = auVar151._4_4_ * fVar54 + fVar106;
                      auVar88._8_4_ = fVar117 * fVar54 + fVar106;
                      auVar88._12_4_ = fVar133 * fVar54 + fVar106;
                      auVar88._16_4_ = fVar135 * fVar54 + fVar106;
                      auVar88._20_4_ = fVar137 * fVar54 + fVar106;
                      auVar88._24_4_ = fVar139 * fVar54 + fVar106;
                      auVar88._28_4_ = fVar54 + fVar106;
                      auVar150 = vmaxps_avx(auVar88,auVar59._0_32_);
                      auVar150 = vminps_avx(auVar150,auVar114);
                      auVar84 = auVar150._0_28_;
LAB_00456051:
                      auVar112 = ZEXT3264(auVar105);
                      auVar152._0_4_ = auVar151._0_4_ * auVar84._0_4_;
                      auVar152._4_4_ = auVar151._4_4_ * auVar84._4_4_;
                      auVar152._8_4_ = fVar117 * auVar84._8_4_;
                      auVar152._12_4_ = fVar133 * auVar84._12_4_;
                      auVar152._16_4_ = fVar135 * auVar84._16_4_;
                      auVar152._20_4_ = fVar137 * auVar84._20_4_;
                      auVar152._24_4_ = fVar139 * auVar84._24_4_;
                      auVar150 = auVar152._0_32_;
                    }
                    *pauVar50 = auVar150;
                    pauVar50 = pauVar50 + 1;
                    iVar45 = iVar45 + 1;
                    local_2c8 = local_2c8 + 1;
                  } while (iVar45 != _w);
                }
                iVar36 = iVar36 + 1;
              } while (iVar36 != _h);
            }
            local_2e0 = local_2e0 + 1;
          } while (local_2e0 != uVar41);
        }
      }
    }
    else {
      uVar32 = (int)(uVar32 * iVar48) / iVar46;
      local_238._0_4_ = *(int *)(&this->field_0xd0 + (long)p_Var39) / iVar46;
      local_2b8 = 1;
      local_2a8 = 1;
      if (opt->use_packing_layout == true) {
        local_2b8 = (uint)((uVar32 & 3) == 0) * 3 + 1;
        if ((uVar32 & 7) == 0) {
          local_2b8 = 8;
        }
        local_2a8 = (uint)(((uint)local_238 & 3) == 0) * 3 + 1;
        if (((uint)local_238 & 7) == 0) {
          local_2a8 = 8;
        }
      }
      piVar12 = bottom_blob->refcount;
      local_1a8._0_8_ = bottom_blob->data;
      local_1a8._8_4_ = SUB84(bottom_blob->refcount,0);
      local_1a8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_1a8._16_8_ = bottom_blob->elemsize;
      local_1a8._24_4_ = bottom_blob->elempack;
      local_1a8._32_8_ = bottom_blob->allocator;
      local_180._0_4_ = bottom_blob->dims;
      local_180._4_4_ = bottom_blob->w;
      local_180._8_4_ = bottom_blob->h;
      local_180._12_4_ = bottom_blob->d;
      local_170 = bottom_blob->c;
      local_168 = bottom_blob->cstep;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      if (local_2b8 < iVar48) {
        local_1f8._0_8_ = *(undefined8 *)opt;
        local_1f8._16_8_ = opt->workspace_allocator;
        uVar21 = opt->openmp_blocktime;
        uVar22 = opt->use_winograd_convolution;
        uVar24 = opt->use_sgemm_convolution;
        uVar26 = opt->use_int8_inference;
        uVar28 = opt->use_vulkan_compute;
        uVar27 = CONCAT11(uVar28,uVar26);
        uVar25 = CONCAT21(uVar27,uVar24);
        uVar23 = CONCAT31(uVar25,uVar22);
        local_1f8._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
        auStack_1d0[0] = opt->use_shader_pack8;
        auStack_1d0[1] = opt->use_subgroup_basic;
        auStack_1d0[2] = opt->use_subgroup_vote;
        auStack_1d0[3] = opt->use_subgroup_ballot;
        auStack_1d0[4] = opt->use_subgroup_shuffle;
        auStack_1d0[5] = opt->use_image_storage;
        auStack_1d0[6] = opt->use_tensor_storage;
        auStack_1d0[7] = opt->use_reserved_0;
        auStack_1d0._8_4_ = opt->flush_denormals;
        auStack_1d0[0xc] = opt->use_local_pool_allocator;
        auStack_1d0[0xd] = opt->use_shader_local_memory;
        auStack_1d0[0xe] = opt->use_cooperative_matrix;
        auStack_1d0[0xf] = opt->use_winograd23_convolution;
        uStack_1c0._0_1_ = opt->use_winograd43_convolution;
        uStack_1c0._1_1_ = opt->use_winograd63_convolution;
        uStack_1c0._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_1c0._3_1_ = opt->use_reserved_7;
        uStack_1c0._4_1_ = opt->use_reserved_8;
        uStack_1c0._5_1_ = opt->use_reserved_9;
        uStack_1c0._6_1_ = opt->use_reserved_10;
        uStack_1c0._7_1_ = opt->use_reserved_11;
        local_1f8._8_4_ = SUB84(opt->workspace_allocator,0);
        local_1f8._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        local_1f8._24_4_ = uVar21;
        local_1f8._28_4_ = uVar23;
        convert_packing(bottom_blob,(Mat *)local_1a8,local_2b8,(Option *)local_1f8);
      }
      piVar12 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      local_1f8._0_8_ = local_288.data;
      local_1f8._8_4_ = local_288.refcount._0_4_;
      local_1f8._12_4_ = local_288.refcount._4_4_;
      local_1f8._16_8_ = local_288.elemsize;
      local_1f8._24_4_ = local_288.elempack;
      local_1f8._32_8_ = local_288.allocator;
      auStack_1d0._4_4_ = local_288.w;
      auStack_1d0._0_4_ = local_288.dims;
      auStack_1d0._8_4_ = local_288.h;
      auStack_1d0._12_4_ = local_288.d;
      uStack_1c0 = CONCAT44(uStack_1c0._4_4_,local_288.c);
      local_1b8 = local_288.cstep;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      if ((local_2a8 < uVar31) &&
         ((Mat::create((Mat *)local_1f8,_w,_h,
                       *(int *)(&this->field_0xd0 +
                               (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]) /
                       (int)local_2a8,(ulong)local_2a8 * (sVar47 / uVar31),local_2a8,
                       opt->workspace_allocator), (void *)local_1f8._0_8_ == (void *)0x0 ||
          ((long)(int)uStack_1c0 * local_1b8 == 0)))) {
        piVar12 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
        iVar48 = -100;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
              if ((void *)local_1f8._0_8_ != (void *)0x0) {
                free((void *)local_1f8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_1f8._32_8_)[3])();
            }
          }
        }
        local_1b8 = 0;
        local_1f8._0_8_ = (void *)0x0;
        local_1f8._8_4_ = 0;
        local_1f8._12_4_ = 0;
        local_1f8._16_8_ = (Allocator *)0x0;
        local_1f8._24_4_ = 0;
        auStack_1d0 = (undefined1  [16])0x0;
        uStack_1c0 = uStack_1c0 & 0xffffffff00000000;
        piVar12 = (int *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if ((Allocator *)local_1a8._32_8_ == (Allocator *)0x0) {
              if ((void *)local_1a8._0_8_ != (void *)0x0) {
                free((void *)local_1a8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_1a8._32_8_)[3])();
            }
          }
        }
        local_168 = 0;
        local_1a8._0_8_ = (void *)0x0;
        local_1a8._8_4_ = 0;
        local_1a8._12_4_ = 0;
        local_1a8._16_8_ = 0;
        local_1a8._24_4_ = 0;
        local_180 = (undefined1  [16])0x0;
        local_170 = 0;
        goto LAB_004574af;
      }
      if (0 < *(int *)(&this->field_0x114 + (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3])) {
        iVar36 = (int)(uint)local_238 / (int)local_2a8;
        iVar45 = 0;
        iVar48 = 0;
        lVar42 = 0;
        do {
          local_d8 = (void *)((long)(iVar45 / local_2b8) * local_168 * local_1a8._16_8_ +
                             local_1a8._0_8_);
          uStack_d0 = 0;
          uStack_cc = 0;
          local_c8 = local_1a8._16_8_;
          local_c0 = local_1a8._24_4_;
          local_b8 = (Allocator *)local_1a8._32_8_;
          local_98 = ((long)(int)local_180._12_4_ * local_1a8._16_8_ *
                      (long)(int)local_180._8_4_ * (long)(int)local_180._4_4_ + 0xfU &
                     0xfffffffffffffff0) / (ulong)local_1a8._16_8_;
          local_b0 = local_180;
          local_128 = (void *)((long)(iVar48 / (int)local_2a8) * local_1b8 * local_1f8._16_8_ +
                              local_1f8._0_8_);
          uStack_120 = 0;
          uStack_11c = 0;
          local_118 = (Allocator *)local_1f8._16_8_;
          local_110 = local_1f8._24_4_;
          local_108 = (Allocator *)local_1f8._32_8_;
          local_e8 = ((long)(int)auStack_1d0._12_4_ * local_1f8._16_8_ *
                      (long)(int)auStack_1d0._8_4_ * (long)(int)auStack_1d0._4_4_ + 0xfU &
                     0xfffffffffffffff0) / (ulong)local_1f8._16_8_;
          local_100 = auStack_1d0;
          pLVar14 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          pAStack_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          pAStack_70 = (Allocator *)local_1f8._32_8_;
          local_f0 = iVar36;
          local_a0 = (int)uVar32 / local_2b8;
          (*pLVar14->_vptr_Layer[7])(pLVar14,&local_d8,&local_128,&local_78);
          piVar12 = (int *)CONCAT44(uStack_11c,uStack_120);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (local_108 == (Allocator *)0x0) {
                if (local_128 != (void *)0x0) {
                  free(local_128);
                }
              }
              else {
                (*local_108->_vptr_Allocator[3])();
              }
            }
          }
          local_e8 = 0;
          local_128 = (void *)0x0;
          uStack_120 = 0;
          uStack_11c = 0;
          local_118 = (Allocator *)0x0;
          local_110 = 0;
          local_100 = (undefined1  [16])0x0;
          local_f0 = 0;
          piVar12 = (int *)CONCAT44(uStack_cc,uStack_d0);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (local_b8 == (Allocator *)0x0) {
                if (local_d8 != (void *)0x0) {
                  free(local_d8);
                }
              }
              else {
                (*local_b8->_vptr_Allocator[3])();
              }
            }
          }
          local_98 = 0;
          local_d8 = (void *)0x0;
          uStack_d0 = 0;
          uStack_cc = 0;
          local_c8 = 0;
          local_c0 = 0;
          local_b0 = (undefined1  [16])0x0;
          local_a0 = 0;
          lVar42 = lVar42 + 1;
          iVar48 = iVar48 + (uint)local_238;
          iVar45 = iVar45 + uVar32;
        } while (lVar42 < *(int *)(&this->field_0x114 +
                                  (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      }
      if (local_2a8 < uVar31) {
        convert_packing((Mat *)local_1f8,&local_288,uVar31,opt);
      }
      else {
        piVar12 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        piVar12 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              if (local_288.data != (void *)0x0) {
                free(local_288.data);
              }
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        auVar91 = auStack_1d0;
        local_288.data = (void *)local_1f8._0_8_;
        local_288.refcount._0_4_ = local_1f8._8_4_;
        local_288.refcount._4_4_ = local_1f8._12_4_;
        local_288.elemsize = local_1f8._16_8_;
        local_288.elempack = local_1f8._24_4_;
        local_288.allocator = (Allocator *)local_1f8._32_8_;
        local_288.dims = auStack_1d0._0_4_;
        local_288.w = auStack_1d0._4_4_;
        local_288.h = auStack_1d0._8_4_;
        local_288.d = auStack_1d0._12_4_;
        local_288.c = (int)uStack_1c0;
        local_288.cstep = local_1b8;
        auStack_1d0 = auVar91;
      }
      piVar12 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_1f8._0_8_ != (void *)0x0) {
              free((void *)local_1f8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_1f8._32_8_)[3])();
          }
        }
      }
      local_1b8 = 0;
      local_1f8._0_8_ = (void *)0x0;
      local_1f8._8_4_ = 0;
      local_1f8._12_4_ = 0;
      local_1f8._16_8_ = (Allocator *)0x0;
      local_1f8._24_4_ = 0;
      auStack_1d0 = (undefined1  [16])0x0;
      uStack_1c0 = uStack_1c0 & 0xffffffff00000000;
      piVar12 = (int *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_1a8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_1a8._0_8_ != (void *)0x0) {
              free((void *)local_1a8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_1a8._32_8_)[3])();
          }
        }
      }
      local_168 = 0;
      local_1a8._0_8_ = (void *)0x0;
      local_1a8._8_4_ = 0;
      local_1a8._12_4_ = 0;
      local_1a8._16_8_ = 0;
      local_1a8._24_4_ = 0;
      local_180 = (undefined1  [16])0x0;
      local_170 = 0;
    }
    pMVar29 = local_150;
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx +
               (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]),&local_288,local_150,opt);
    iVar48 = -100;
    if ((pMVar29->data != (void *)0x0) && (iVar48 = -100, (long)pMVar29->c * pMVar29->cstep != 0)) {
      iVar48 = 0;
    }
  }
LAB_004574af:
  piVar12 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar48;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}